

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleBase::setupLeafNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,
          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
          *values)

{
  pointer ppVar1;
  TreeEnsembleParameters_TreeNode *pTVar2;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *pTVar3;
  pair<unsigned_long,_double> *p;
  pointer ppVar4;
  
  pTVar2 = _getNode(this,treeId,nodeId,true);
  pTVar2->nodebehavior_ = 6;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
            (&(pTVar2->evaluationinfo_).super_RepeatedPtrFieldBase);
  ppVar1 = (values->
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (values->
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    pTVar3 = google::protobuf::
             RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
             ::Add(&pTVar2->evaluationinfo_);
    pTVar3->evaluationindex_ = ppVar4->first;
    pTVar3->evaluationvalue_ = ppVar4->second;
  }
  return;
}

Assistant:

void TreeEnsembleBase::setupLeafNode(size_t treeId, size_t nodeId,
                                         const std::vector<std::pair<size_t, double> >& values) {
        Specification::TreeEnsembleParameters::TreeNode& node = _getNode(treeId, nodeId, true);

        // TODO: Error checking routines -- make sure this node hasn't been requested before.
        node.set_nodebehavior(Specification::TreeEnsembleParameters::TreeNode::LeafNode);

        node.clear_evaluationinfo();
        for(const auto& p : values) {
            auto ei = node.add_evaluationinfo();
            ei->set_evaluationindex(p.first);
            ei->set_evaluationvalue(p.second);
        }
    }